

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O0

void InstructionSet::M68k::Primitive::add_sub<true,true,unsigned_int>
               (uint source,uint *destination,Status *status)

{
  uint uVar1;
  uint local_24;
  uint result;
  Status *status_local;
  uint *destination_local;
  uint source_local;
  
  local_24 = *destination + source;
  status->carry_flag = (ulong)(local_24 < *destination);
  if (status->extend_flag != 0) {
    local_24 = local_24 + 1;
    status->carry_flag = (ulong)(local_24 == 0) | status->carry_flag;
  }
  status->extend_flag = status->carry_flag;
  status->zero_result = (ulong)local_24 | status->zero_result;
  Status::set_negative<unsigned_int>(status,local_24);
  uVar1 = Numeric::overflow<true,unsigned_int>(*destination,source,local_24);
  status->overflow_flag = (ulong)uVar1;
  *destination = local_24;
  return;
}

Assistant:

static void add_sub(IntT source, IntT &destination, Status &status) {
	static_assert(!std::numeric_limits<IntT>::is_signed);

	IntT result = is_add ?
		destination + source :
		destination - source;
	status.carry_flag = is_add ? result < destination : result > destination;

	// If this is an extend operation, there's a second opportunity to create carry,
	// which requires a second test.
	if(is_extend && status.extend_flag) {
		if constexpr (is_add) {
			++result;
			status.carry_flag |= result == 0;
		} else {
			status.carry_flag |= result == 0;
			--result;
		}
	}
	status.extend_flag = status.carry_flag;

	// Extend operations can reset the zero flag only; non-extend operations
	// can either set it or reset it. Which in the reverse-logic world of
	// zero_result means ORing or storing.
	if constexpr (is_extend) {
		status.zero_result |= Status::FlagT(result);
	} else {
		status.zero_result = Status::FlagT(result);
	}
	status.set_negative(result);
	status.overflow_flag = Numeric::overflow<is_add>(destination, source, result);
	destination = result;
}